

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::ParameterSetupErrorsTest::Testf(ParameterSetupErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  undefined4 extraout_var;
  ErrorsUtilities *pEVar14;
  long lVar13;
  
  iVar12 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar12);
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar13 + 0x1418))(0x3f800000,pEVar14,this->m_pname_invalid);
  bVar1 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x500,"glTextureParameterf",
                     "pname is not one of the accepted defined values.");
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar13 + 0x1418))((float)this->m_depth_stencil_mode_invalid,pEVar14,0x90ea);
  bVar2 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x500,"glTextureParameterf",
                     "params should have a defined constant value (based on the value of pname) and does not."
                    );
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar13 + 0x1418))(0x3f800000,pEVar14,0x1004);
  bVar3 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x500,"glTextureParameterf",
                     "called for a non-scalar parameter (pname TEXTURE_BORDER_COLOR or TEXTURE_SWIZZLE_RGBA)."
                    );
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D_ms;
  (**(code **)(lVar13 + 0x1418))(0x3f800000,pEVar14,0x8501);
  bVar4 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x500,"glTextureParameterf",
                     "the  effective target is either TEXTURE_2D_MULTISAMPLE or  TEXTURE_2D_MULTISAMPLE_ARRAY, and pname is any of the sampler states."
                    );
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_rectangle;
  (**(code **)(lVar13 + 0x1418))(0x47074300,pEVar14,0x2802);
  bVar5 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x500,"glTextureParameterf",
                     "the effective target is TEXTURE_RECTANGLE and either of pnames TEXTURE_WRAP_S or TEXTURE_WRAP_T is set to either MIRROR_CLAMP_TO_EDGE, MIRRORED_REPEAT or REPEAT."
                    );
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_rectangle;
  (**(code **)(lVar13 + 0x1418))(0x461c0000,pEVar14,0x2801);
  bVar6 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x500,"glTextureParameterf",
                     "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_MIN_FILTER is set to a value other than NEAREST or LINEAR (no mipmap filtering is permitted)."
                    );
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D_ms;
  (**(code **)(lVar13 + 0x1418))(0x3f800000,pEVar14,0x813c);
  bVar7 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x502,"glTextureParameterf",
                     "the effective target is either TEXTURE_2D_MULTISAMPLE or TEXTURE_2D_MULTISAMPLE_ARRAY, and pname TEXTURE_BASE_LEVEL is set to a value other than zero."
                    );
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_invalid;
  (**(code **)(lVar13 + 0x1418))(0x3f800000,pEVar14,0x8501);
  bVar8 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x502,"glTextureParameterf",
                     "texture is not the name of an existing texture object.");
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_rectangle;
  (**(code **)(lVar13 + 0x1418))(0x3f800000,pEVar14,0x813c);
  bVar9 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar14,(this->super_TestCase).m_context,0x502,"glTextureParameterf",
                     "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_BASE_LEVEL is set to any value other than zero. "
                    );
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar13 + 0x1418))(0xbf800000,pEVar14,0x813c);
  bVar10 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar14,(this->super_TestCase).m_context,0x501,"glTextureParameterf",
                      "pname is TEXTURE_BASE_LEVEL and param is negative.");
  pEVar14 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar13 + 0x1418))(0xbf800000,pEVar14,0x813d);
  bVar11 = ErrorsUtilities::CheckErrorAndLog
                     (pEVar14,(this->super_TestCase).m_context,0x501,"glTextureParameterf",
                      "pname is TEXTURE_MAX_LEVEL and param is negative.");
  return (bVar11 && (bVar10 && (bVar9 && bVar8))) &&
         ((bVar7 && (bVar6 && bVar5)) && ((bVar4 && bVar3) && (bVar2 && bVar1)));
}

Assistant:

bool ParameterSetupErrorsTest::Testf()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	/* Check that INVALID_ENUM is generated by TextureParameter* if pname is
	 not one of the accepted defined values. */
	{
		gl.textureParameterf(m_to_2D, m_pname_invalid, 1.f);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterf",
								  "pname is not one of the accepted defined values.");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if params
	 should have a defined constant value (based on the value of pname) and
	 does not. */
	{
		gl.textureParameterf(m_to_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, (glw::GLfloat)m_depth_stencil_mode_invalid);

		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterf",
							 "params should have a defined constant value (based on the value of pname) and does not.");
	}
	/* Check that INVALID_ENUM is generated if TextureParameter{if} is called
	 for a non-scalar parameter (pname TEXTURE_BORDER_COLOR or
	 TEXTURE_SWIZZLE_RGBA). */
	{
		gl.textureParameterf(m_to_2D, GL_TEXTURE_BORDER_COLOR, 1.f);

		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterf",
							 "called for a non-scalar parameter (pname TEXTURE_BORDER_COLOR or TEXTURE_SWIZZLE_RGBA).");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if the
	 effective target is either TEXTURE_2D_MULTISAMPLE or
	 TEXTURE_2D_MULTISAMPLE_ARRAY, and pname is any of the sampler states. */
	{
		gl.textureParameterf(m_to_2D_ms, GL_TEXTURE_LOD_BIAS, 1.f);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterf",
								  "the  effective target is either TEXTURE_2D_MULTISAMPLE or  "
								  "TEXTURE_2D_MULTISAMPLE_ARRAY, and pname is any of the sampler states.");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if the
	 effective target is TEXTURE_RECTANGLE and either of pnames
	 TEXTURE_WRAP_S or TEXTURE_WRAP_T is set to either MIRROR_CLAMP_TO_EDGE,
	 MIRRORED_REPEAT or REPEAT. */
	{
		gl.textureParameterf(m_to_rectangle, GL_TEXTURE_WRAP_S, GL_MIRROR_CLAMP_TO_EDGE);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterf",
								  "the effective target is TEXTURE_RECTANGLE and either of pnames TEXTURE_WRAP_S or "
								  "TEXTURE_WRAP_T is set to either MIRROR_CLAMP_TO_EDGE, MIRRORED_REPEAT or REPEAT.");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if the
	 effective target is TEXTURE_RECTANGLE and pname TEXTURE_MIN_FILTER is
	 set to a value other than NEAREST or LINEAR (no mipmap filtering is
	 permitted). */
	{
		gl.textureParameterf(m_to_rectangle, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterf",
								  "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_MIN_FILTER is set to a "
								  "value other than NEAREST or LINEAR (no mipmap filtering is permitted).");
	}

	/* Check that INVALID_OPERATION is generated by TextureParameter* if the
	 effective target is either TEXTURE_2D_MULTISAMPLE or
	 TEXTURE_2D_MULTISAMPLE_ARRAY, and pname TEXTURE_BASE_LEVEL is set to a
	 value other than zero. */
	{
		gl.textureParameterf(m_to_2D_ms, GL_TEXTURE_BASE_LEVEL, 1.f);

		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureParameterf",
							 "the effective target is either TEXTURE_2D_MULTISAMPLE or TEXTURE_2D_MULTISAMPLE_ARRAY, "
							 "and pname TEXTURE_BASE_LEVEL is set to a value other than zero.");
	}

	/* Check that INVALID_OPERATION is generated by TextureParameter* if
	 texture is not the name of an existing texture object. */
	{
		gl.textureParameterf(m_to_invalid, GL_TEXTURE_LOD_BIAS, 1.f);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureParameterf",
								  "texture is not the name of an existing texture object.");
	}

	/* Check that INVALID_OPERATION is generated by TextureParameter* if the
	 effective target is TEXTURE_RECTANGLE and pname TEXTURE_BASE_LEVEL is
	 set to any value other than zero. */
	{
		gl.textureParameterf(m_to_rectangle, GL_TEXTURE_BASE_LEVEL, 1.f);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureParameterf",
								  "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_BASE_LEVEL is set to "
								  "any value other than zero. ");
	}

	/* Check that INVALID_VALUE is generated by TextureParameter* if pname is
	 TEXTURE_BASE_LEVEL or TEXTURE_MAX_LEVEL, and param or params is
	 negative. */
	{
		gl.textureParameterf(m_to_2D, GL_TEXTURE_BASE_LEVEL, -1.f);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureParameterf",
								  "pname is TEXTURE_BASE_LEVEL and param is negative.");

		gl.textureParameterf(m_to_2D, GL_TEXTURE_MAX_LEVEL, -1.f);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureParameterf",
								  "pname is TEXTURE_MAX_LEVEL and param is negative.");
	}

	return is_ok;
}